

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O0

int __thiscall ModelWriter::shape_inference(ModelWriter *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  value_type pLVar4;
  int *piVar5;
  Allocator *pAVar6;
  FILE *pFVar7;
  ulong uVar8;
  bool bVar9;
  reference ppLVar10;
  undefined8 uVar11;
  size_type sVar12;
  const_reference pvVar13;
  reference pvVar14;
  Mat *pMVar15;
  reference pvVar16;
  reference pvVar17;
  size_type sVar18;
  long in_RDI;
  int top_blob_index_1;
  size_t j_2;
  int bottom_blob_index;
  size_t j_1;
  Layer *layer_3;
  size_t i_5;
  Mat m_2;
  int top_blob_index;
  size_t j;
  Layer *layer_2;
  size_t i_4;
  Mat m_1;
  int c_1;
  int h_1;
  int w_1;
  int dims_1;
  Blob *blob;
  size_t i_2;
  Mat m;
  int dims;
  int c;
  int h;
  int w;
  Input *input;
  Layer *layer_1;
  size_t i_1;
  Extractor ex;
  int cret;
  Layer *layer;
  size_t i;
  size_t blob_count;
  size_t layer_count;
  int i_3;
  float *ptr;
  int size;
  reference in_stack_fffffffffffffb98;
  reference in_stack_fffffffffffffba0;
  Net *in_stack_fffffffffffffba8;
  reference pvVar19;
  Allocator *in_stack_fffffffffffffbb0;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_stack_fffffffffffffbb8;
  reference in_stack_fffffffffffffbc0;
  undefined8 in_stack_fffffffffffffbc8;
  Mat *in_stack_fffffffffffffbd0;
  size_type local_370;
  ulong local_360;
  size_type local_350;
  void *local_348;
  int *local_340;
  undefined8 local_338;
  undefined4 local_330;
  long *local_328;
  undefined4 local_320;
  undefined4 local_31c;
  undefined4 local_318;
  undefined4 local_314;
  undefined4 local_310;
  undefined8 local_308;
  int local_2fc;
  ulong local_2f8;
  value_type local_2f0;
  size_type local_2e8;
  undefined4 *local_2e0;
  int *local_2d8;
  undefined8 local_2d0;
  undefined4 local_2c8;
  long *local_2c0;
  undefined4 local_2b8;
  undefined4 local_2b4;
  undefined4 local_2b0;
  undefined4 local_2ac;
  int local_2a8;
  undefined8 local_2a0;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  reference local_288;
  size_type local_280;
  void *local_278;
  int *local_270;
  undefined8 local_268;
  undefined4 local_260;
  long *local_258;
  undefined4 local_250;
  int in_stack_fffffffffffffdb4;
  undefined4 uVar20;
  Mat *in_stack_fffffffffffffdb8;
  int in_stack_fffffffffffffdc4;
  Extractor *in_stack_fffffffffffffdc8;
  int local_228;
  size_type local_208;
  Extractor local_1f0;
  int local_1dc;
  value_type local_1d8;
  size_type local_1d0;
  size_type local_1c8;
  size_type local_1c0;
  int local_1ac;
  void **local_1a8;
  undefined4 **local_1a0;
  void **local_198;
  void **local_190;
  undefined4 **local_180;
  void **local_170;
  int local_15c;
  undefined4 *local_158;
  int local_150;
  undefined4 local_14c;
  undefined4 **local_148;
  int local_140;
  undefined4 local_13c;
  reference local_138;
  reference local_130;
  reference local_128;
  int local_120;
  undefined4 local_11c;
  reference local_118;
  reference local_110;
  reference local_108;
  int local_100;
  undefined4 local_fc;
  void **local_f8;
  Mat *local_f0;
  Mat *local_e8;
  int local_e0;
  undefined4 local_dc;
  Mat *local_d8;
  int local_d0;
  undefined4 local_cc;
  reference local_c8;
  int local_c0;
  undefined4 local_bc;
  reference local_b8;
  int local_a0;
  undefined4 local_9c;
  void **local_98;
  int local_80;
  undefined4 local_7c;
  undefined4 **local_78;
  int local_60;
  undefined4 local_5c;
  void **local_58;
  void *local_50;
  undefined4 *local_40;
  void *local_30;
  void *local_20;
  void *local_18;
  void *local_10;
  undefined4 **local_8;
  
  if ((*(byte *)(in_RDI + 0x60) & 1) == 0) {
    local_1c0 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                          (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                            (in_RDI + 0x58));
    local_1c8 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::size
                          (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50));
    for (local_1d0 = 0; local_1d0 < local_1c0; local_1d0 = local_1d0 + 1) {
      ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                           (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                             (in_RDI + 0x58),local_1d0);
      local_1d8 = *ppLVar10;
      (*local_1d8->_vptr_Layer[5])(local_1d8,in_RDI + 8);
      local_1dc = (*local_1d8->_vptr_Layer[4])(local_1d8,in_RDI + 8);
      sVar12 = local_1d0;
      pFVar7 = _stderr;
      if (local_1dc != 0) {
        uVar11 = std::__cxx11::string::c_str();
        fprintf(pFVar7,"layer create_pipeline %d %s failed",sVar12 & 0xffffffff,uVar11);
        fprintf(_stderr,"\n");
        return -1;
      }
      local_1dc = 0;
    }
    ncnn::Net::create_extractor(in_stack_fffffffffffffba8);
    ncnn::Extractor::set_light_mode(&local_1f0,true);
    for (local_208 = 0; local_208 < local_1c0; local_208 = local_208 + 1) {
      ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                           (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                             (in_RDI + 0x58),local_208);
      pLVar4 = *ppLVar10;
      bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
      if ((!bVar9) &&
         (bVar9 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98),
         pFVar7 = _stderr, !bVar9)) {
        iVar1 = *(int *)&pLVar4[1]._vptr_Layer;
        iVar2 = *(int *)((long)&pLVar4[1]._vptr_Layer + 4);
        iVar3._0_1_ = pLVar4[1].support_bf16_storage;
        iVar3._1_1_ = pLVar4[1].support_fp16_storage;
        iVar3._2_1_ = pLVar4[1].support_int8_storage;
        iVar3._3_1_ = pLVar4[1].support_image_storage;
        local_228 = 0;
        if ((iVar1 != 0) && ((iVar2 == 0 && (iVar3 == 0)))) {
          local_228 = 1;
        }
        if (((iVar1 != 0) && (iVar2 != 0)) && (iVar3 == 0)) {
          local_228 = 2;
        }
        if (((iVar1 != 0) && (iVar2 != 0)) && (iVar3 != 0)) {
          local_228 = 3;
        }
        if (local_228 == 0) {
          uVar11 = std::__cxx11::string::c_str();
          fprintf(pFVar7,"Input layer %s without shape info, shape_inference skipped\n",uVar11);
          local_1ac = -1;
          goto LAB_00169619;
        }
        local_1a8 = &local_278;
        local_278 = (void *)0x0;
        local_270 = (int *)0x0;
        local_268 = 0;
        local_260 = 0;
        local_258 = (long *)0x0;
        local_250 = 0;
        uVar20 = 0;
        uVar20 = 0;
        if (local_228 == 1) {
          ncnn::Mat::create(in_stack_fffffffffffffbc0,
                            (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                            (size_t)in_stack_fffffffffffffbb0,(Allocator *)in_stack_fffffffffffffba8
                           );
        }
        if (local_228 == 2) {
          ncnn::Mat::create(in_stack_fffffffffffffbc0,
                            (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                            (int)in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0,
                            (Allocator *)in_stack_fffffffffffffba8);
        }
        if (local_228 == 3) {
          ncnn::Mat::create(in_stack_fffffffffffffbd0,
                            (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                            (int)in_stack_fffffffffffffbc8,
                            (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                            (size_t)in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
        }
        std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->tops,0);
        ncnn::Extractor::input
                  ((Extractor *)in_stack_fffffffffffffbd0,
                   (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),in_stack_fffffffffffffbc0);
        local_190 = &local_278;
        local_58 = local_190;
        if (local_270 != (int *)0x0) {
          local_5c = 0xffffffff;
          LOCK();
          local_60 = *local_270;
          *local_270 = *local_270 + -1;
          UNLOCK();
          if (local_60 == 1) {
            if (local_258 == (long *)0x0) {
              local_50 = local_278;
              if (local_278 != (void *)0x0) {
                free(local_278);
              }
            }
            else {
              (**(code **)(*local_258 + 0x18))(local_258,local_278);
            }
          }
        }
        local_278 = (void *)0x0;
        local_268 = 0;
        local_260 = 0;
        local_250 = 0;
        in_stack_fffffffffffffdb4 = 0;
        uVar20 = 0;
        in_stack_fffffffffffffdc8 = (Extractor *)0x0;
        local_270 = (int *)0x0;
      }
    }
    for (local_280 = 0; local_280 < local_1c8; local_280 = local_280 + 1) {
      local_288 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                            (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                             local_280);
      local_28c = (local_288->shape).dims;
      local_290 = (local_288->shape).w;
      local_294 = (local_288->shape).h;
      local_298 = (local_288->shape).c;
      if (local_28c != 0) {
        local_1a0 = &local_2e0;
        local_2e0 = (undefined4 *)0x0;
        local_2d8 = (int *)0x0;
        local_2d0 = 0;
        local_2c8 = 0;
        local_2c0 = (long *)0x0;
        local_2b8 = 0;
        local_2b4 = 0;
        local_2b0 = 0;
        local_2ac = 0;
        local_2a8 = 0;
        local_2a0 = 0;
        if (local_28c == 1) {
          ncnn::Mat::create(in_stack_fffffffffffffbc0,
                            (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                            (size_t)in_stack_fffffffffffffbb0,(Allocator *)in_stack_fffffffffffffba8
                           );
        }
        if (local_28c == 2) {
          ncnn::Mat::create(in_stack_fffffffffffffbc0,
                            (int)((ulong)in_stack_fffffffffffffbb8 >> 0x20),
                            (int)in_stack_fffffffffffffbb8,(size_t)in_stack_fffffffffffffbb0,
                            (Allocator *)in_stack_fffffffffffffba8);
        }
        if (local_28c == 3) {
          ncnn::Mat::create(in_stack_fffffffffffffbd0,
                            (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),
                            (int)in_stack_fffffffffffffbc8,
                            (int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                            (size_t)in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
        }
        local_148 = &local_2e0;
        local_14c = 0;
        local_150 = (int)local_2a0 * local_2a8;
        local_158 = local_2e0;
        for (local_15c = 0; local_15c < local_150; local_15c = local_15c + 1) {
          *local_158 = 0;
          local_158 = local_158 + 1;
        }
        local_8 = local_148;
        ncnn::Extractor::input
                  ((Extractor *)in_stack_fffffffffffffbd0,
                   (int)((ulong)in_stack_fffffffffffffbc8 >> 0x20),in_stack_fffffffffffffbc0);
        local_180 = &local_2e0;
        local_78 = local_180;
        if (local_2d8 != (int *)0x0) {
          local_7c = 0xffffffff;
          LOCK();
          local_80 = *local_2d8;
          *local_2d8 = *local_2d8 + -1;
          UNLOCK();
          if (local_80 == 1) {
            if (local_2c0 == (long *)0x0) {
              local_40 = local_2e0;
              if (local_2e0 != (undefined4 *)0x0) {
                free(local_2e0);
              }
            }
            else {
              (**(code **)(*local_2c0 + 0x18))(local_2c0,local_2e0);
            }
          }
        }
        local_2e0 = (undefined4 *)0x0;
        local_2d0 = 0;
        local_2c8 = 0;
        local_2b8 = 0;
        local_2b4 = 0;
        local_2b0 = 0;
        local_2ac = 0;
        local_2a8 = 0;
        local_2a0 = 0;
        local_2d8 = (int *)0x0;
      }
    }
    fprintf(_stderr,"shape_inference\n");
    for (local_2e8 = 0; local_2e8 < local_1c0; local_2e8 = local_2e8 + 1) {
      ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                           (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                             (in_RDI + 0x58),local_2e8);
      local_2f0 = *ppLVar10;
      bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
      if (!bVar9) {
        for (local_2f8 = 0; uVar8 = local_2f8,
            sVar12 = std::vector<int,_std::allocator<int>_>::size(&local_2f0->tops), uVar8 < sVar12;
            local_2f8 = local_2f8 + 1) {
          pvVar13 = std::vector<int,_std::allocator<int>_>::operator[](&local_2f0->tops,local_2f8);
          local_2fc = *pvVar13;
          local_198 = &local_348;
          local_348 = (void *)0x0;
          local_340 = (int *)0x0;
          local_338 = 0;
          local_330 = 0;
          local_328 = (long *)0x0;
          local_320 = 0;
          local_31c = 0;
          local_318 = 0;
          local_314 = 0;
          local_310 = 0;
          local_308 = 0;
          ncnn::Extractor::extract
                    (in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc4,in_stack_fffffffffffffdb8,
                     in_stack_fffffffffffffdb4);
          pvVar14 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                              (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                               (long)local_2fc);
          pMVar15 = &pvVar14->shape;
          local_f8 = &local_348;
          local_f0 = pMVar15;
          if (pMVar15 != (Mat *)local_f8) {
            if (local_340 != (int *)0x0) {
              local_fc = 1;
              LOCK();
              local_100 = *local_340;
              *local_340 = *local_340 + 1;
              UNLOCK();
            }
            local_d8 = pMVar15;
            if ((pvVar14->shape).refcount != (int *)0x0) {
              piVar5 = (pvVar14->shape).refcount;
              local_dc = 0xffffffff;
              LOCK();
              local_e0 = *piVar5;
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (local_e0 == 1) {
                if ((pvVar14->shape).allocator == (Allocator *)0x0) {
                  local_10 = pMVar15->data;
                  if (local_10 != (void *)0x0) {
                    free(local_10);
                  }
                }
                else {
                  pAVar6 = (pvVar14->shape).allocator;
                  (*pAVar6->_vptr_Allocator[3])(pAVar6,pMVar15->data);
                }
              }
            }
            pMVar15->data = (void *)0x0;
            (pvVar14->shape).elemsize = 0;
            (pvVar14->shape).elempack = 0;
            (pvVar14->shape).dims = 0;
            (pvVar14->shape).w = 0;
            (pvVar14->shape).h = 0;
            (pvVar14->shape).d = 0;
            (pvVar14->shape).c = 0;
            (pvVar14->shape).cstep = 0;
            (pvVar14->shape).refcount = (int *)0x0;
            pMVar15->data = *local_f8;
            (pvVar14->shape).refcount = (int *)local_f8[1];
            (pvVar14->shape).elemsize = (size_t)local_f8[2];
            (pvVar14->shape).elempack = *(int *)(local_f8 + 3);
            (pvVar14->shape).allocator = (Allocator *)local_f8[4];
            (pvVar14->shape).dims = *(int *)(local_f8 + 5);
            (pvVar14->shape).w = *(int *)((long)local_f8 + 0x2c);
            (pvVar14->shape).h = *(int *)(local_f8 + 6);
            (pvVar14->shape).d = *(int *)((long)local_f8 + 0x34);
            (pvVar14->shape).c = *(int *)(local_f8 + 7);
            (pvVar14->shape).cstep = (size_t)local_f8[8];
          }
          local_170 = &local_348;
          local_e8 = pMVar15;
          local_98 = local_170;
          if (local_340 != (int *)0x0) {
            local_9c = 0xffffffff;
            LOCK();
            local_a0 = *local_340;
            *local_340 = *local_340 + -1;
            UNLOCK();
            if (local_a0 == 1) {
              if (local_328 == (long *)0x0) {
                local_30 = local_348;
                if (local_348 != (void *)0x0) {
                  free(local_348);
                }
              }
              else {
                (**(code **)(*local_328 + 0x18))(local_328,local_348);
              }
            }
          }
          local_348 = (void *)0x0;
          local_338 = 0;
          local_330 = 0;
          local_320 = 0;
          local_31c = 0;
          local_318 = 0;
          local_314 = 0;
          local_310 = 0;
          local_308 = 0;
          local_340 = (int *)0x0;
        }
      }
    }
    for (local_350 = 0; local_350 < local_1c0; local_350 = local_350 + 1) {
      ppLVar10 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                           (*(vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> **)
                             (in_RDI + 0x58),local_350);
      pLVar4 = *ppLVar10;
      bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffba0,(char *)in_stack_fffffffffffffb98);
      if (!bVar9) {
        std::vector<int,_std::allocator<int>_>::size(&pLVar4->bottoms);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffffbc0,
                   (size_type)in_stack_fffffffffffffbb8);
        for (local_360 = 0; sVar12 = std::vector<int,_std::allocator<int>_>::size(&pLVar4->bottoms),
            local_360 < sVar12; local_360 = local_360 + 1) {
          pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->bottoms,local_360);
          pvVar14 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                              (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                               (long)*pvVar16);
          pvVar19 = &pvVar14->shape;
          pvVar17 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (&pLVar4->bottom_shapes,local_360);
          local_118 = pvVar19;
          local_110 = pvVar17;
          if (pvVar17 != pvVar19) {
            if (pvVar19->refcount != (int *)0x0) {
              piVar5 = pvVar19->refcount;
              local_11c = 1;
              LOCK();
              local_120 = *piVar5;
              *piVar5 = *piVar5 + 1;
              UNLOCK();
            }
            pvVar19 = pvVar17;
            local_c8 = pvVar17;
            if (pvVar17->refcount != (int *)0x0) {
              piVar5 = pvVar17->refcount;
              local_cc = 0xffffffff;
              LOCK();
              local_d0 = *piVar5;
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (local_d0 == 1) {
                if (pvVar17->allocator == (Allocator *)0x0) {
                  local_18 = pvVar17->data;
                  if (local_18 != (void *)0x0) {
                    free(local_18);
                  }
                }
                else {
                  (*pvVar17->allocator->_vptr_Allocator[3])(pvVar17->allocator,pvVar17->data);
                }
              }
            }
            pvVar17->data = (void *)0x0;
            pvVar17->elemsize = 0;
            pvVar17->elempack = 0;
            pvVar17->dims = 0;
            pvVar17->w = 0;
            pvVar17->h = 0;
            pvVar17->d = 0;
            pvVar17->c = 0;
            pvVar17->cstep = 0;
            pvVar17->refcount = (int *)0x0;
            pvVar19->data = local_118->data;
            pvVar19->refcount = local_118->refcount;
            pvVar19->elemsize = local_118->elemsize;
            pvVar19->elempack = local_118->elempack;
            pvVar19->allocator = local_118->allocator;
            pvVar19->dims = local_118->dims;
            pvVar19->w = local_118->w;
            pvVar19->h = local_118->h;
            pvVar19->d = local_118->d;
            pvVar19->c = local_118->c;
            pvVar19->cstep = local_118->cstep;
            in_stack_fffffffffffffbc0 = pvVar17;
            pvVar17 = pvVar19;
          }
          local_108 = pvVar17;
        }
        in_stack_fffffffffffffbb8 = &pLVar4->top_shapes;
        std::vector<int,_std::allocator<int>_>::size(&pLVar4->tops);
        std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::resize
                  ((vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *)in_stack_fffffffffffffbc0,
                   (size_type)in_stack_fffffffffffffbb8);
        local_370 = 0;
        while (sVar12 = local_370,
              sVar18 = std::vector<int,_std::allocator<int>_>::size(&pLVar4->tops), sVar12 < sVar18)
        {
          pvVar16 = std::vector<int,_std::allocator<int>_>::operator[](&pLVar4->tops,local_370);
          pvVar14 = std::vector<ncnn::Blob,_std::allocator<ncnn::Blob>_>::operator[]
                              (*(vector<ncnn::Blob,_std::allocator<ncnn::Blob>_> **)(in_RDI + 0x50),
                               (long)*pvVar16);
          in_stack_fffffffffffffba0 = &pvVar14->shape;
          pvVar17 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                              (&pLVar4->top_shapes,local_370);
          local_138 = in_stack_fffffffffffffba0;
          local_130 = pvVar17;
          if (pvVar17 != in_stack_fffffffffffffba0) {
            if (in_stack_fffffffffffffba0->refcount != (int *)0x0) {
              piVar5 = in_stack_fffffffffffffba0->refcount;
              local_13c = 1;
              LOCK();
              local_140 = *piVar5;
              *piVar5 = *piVar5 + 1;
              UNLOCK();
            }
            pvVar19 = pvVar17;
            local_b8 = pvVar17;
            if (pvVar17->refcount != (int *)0x0) {
              piVar5 = pvVar17->refcount;
              local_bc = 0xffffffff;
              LOCK();
              local_c0 = *piVar5;
              *piVar5 = *piVar5 + -1;
              UNLOCK();
              if (local_c0 == 1) {
                if (pvVar17->allocator == (Allocator *)0x0) {
                  local_20 = pvVar17->data;
                  if (local_20 != (void *)0x0) {
                    free(local_20);
                  }
                }
                else {
                  (*pvVar17->allocator->_vptr_Allocator[3])(pvVar17->allocator,pvVar17->data);
                }
              }
            }
            pvVar17->data = (void *)0x0;
            pvVar17->elemsize = 0;
            pvVar17->elempack = 0;
            pvVar17->dims = 0;
            pvVar17->w = 0;
            pvVar17->h = 0;
            pvVar17->d = 0;
            pvVar17->c = 0;
            pvVar17->cstep = 0;
            pvVar17->refcount = (int *)0x0;
            pvVar19->data = local_138->data;
            pvVar19->refcount = local_138->refcount;
            pvVar19->elemsize = local_138->elemsize;
            pvVar19->elempack = local_138->elempack;
            pvVar19->allocator = local_138->allocator;
            pvVar19->dims = local_138->dims;
            pvVar19->w = local_138->w;
            pvVar19->h = local_138->h;
            pvVar19->d = local_138->d;
            pvVar19->c = local_138->c;
            pvVar19->cstep = local_138->cstep;
            in_stack_fffffffffffffb98 = pvVar17;
            pvVar17 = pvVar19;
          }
          local_370 = local_370 + 1;
          local_128 = pvVar17;
        }
      }
    }
    local_1ac = 0;
LAB_00169619:
    ncnn::Extractor::~Extractor((Extractor *)in_stack_fffffffffffffba0);
  }
  else {
    fprintf(_stderr,"model has custom layer, shape_inference skipped\n");
    local_1ac = -1;
  }
  return local_1ac;
}

Assistant:

int ModelWriter::shape_inference()
{
    if (has_custom_layer)
    {
        fprintf(stderr, "model has custom layer, shape_inference skipped\n");
        return -1;
    }

    const size_t layer_count = layers.size();
    const size_t blob_count = blobs.size();

    // recreate layer pipeline for param and weight changes
    for (size_t i = 0; i < layer_count; i++)
    {
        ncnn::Layer* layer = layers[i];

        layer->destroy_pipeline(opt);

        int cret = layer->create_pipeline(opt);
        if (cret != 0)
        {
            NCNN_LOGE("layer create_pipeline %d %s failed", (int)i, layer->name.c_str());
            return -1;
        }
    }

    ncnn::Extractor ex = create_extractor();
    ex.set_light_mode(true);

    // prepare Input blobs
    for (size_t i = 0; i < layer_count; i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        if (layer->type != "Input")
            continue;

        ncnn::Input* input = (ncnn::Input*)layer;

        int w = input->w;
        int h = input->h;
        int c = input->c;

        int dims = 0;
        if (w == 0 && h == 0 && c == 0) dims = 0;
        if (w != 0 && h == 0 && c == 0) dims = 1;
        if (w != 0 && h != 0 && c == 0) dims = 2;
        if (w != 0 && h != 0 && c != 0) dims = 3;

        if (dims == 0)
        {
            fprintf(stderr, "Input layer %s without shape info, shape_inference skipped\n", layer->name.c_str());
            return -1;
        }

        ncnn::Mat m;
        if (dims == 1) m.create(w);
        if (dims == 2) m.create(w, h);
        if (dims == 3) m.create(w, h, c);

        ex.input(layer->tops[0], m);
    }

    // prepare blobs with predefined shape
    for (size_t i = 0; i < blob_count; i++)
    {
        const ncnn::Blob& blob = blobs[i];

        int dims = blob.shape.dims;
        int w = blob.shape.w;
        int h = blob.shape.h;
        int c = blob.shape.c;

        if (dims == 0)
            continue;

        ncnn::Mat m;
        if (dims == 1) m.create(w);
        if (dims == 2) m.create(w, h);
        if (dims == 3) m.create(w, h, c);

        m.fill(0.f);

        ex.input(int(i), m);
    }

    fprintf(stderr, "shape_inference\n");

    // resolve all layer output blob shape
    for (size_t i = 0; i < layer_count; i++)
    {
        const ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        for (size_t j = 0; j < layer->tops.size(); j++)
        {
            int top_blob_index = layer->tops[j];

            ncnn::Mat m;
            ex.extract(top_blob_index, m);

            blobs[top_blob_index].shape = m;
        }
    }

    // assign all layer blob shape
    for (size_t i = 0; i < layer_count; i++)
    {
        ncnn::Layer* layer = layers[i];
        if (layer->type == "ncnnfused")
            continue;

        layer->bottom_shapes.resize(layer->bottoms.size());
        for (size_t j = 0; j < layer->bottoms.size(); j++)
        {
            int bottom_blob_index = layer->bottoms[j];

            layer->bottom_shapes[j] = blobs[bottom_blob_index].shape;
        }

        layer->top_shapes.resize(layer->tops.size());
        for (size_t j = 0; j < layer->tops.size(); j++)
        {
            int top_blob_index = layer->tops[j];

            layer->top_shapes[j] = blobs[top_blob_index].shape;

            //             fprintf(stderr, "%d %4d %4d %4d | %2d %s\n", blobs[top_blob_index].shape.dims, blobs[top_blob_index].shape.w, blobs[top_blob_index].shape.h, blobs[top_blob_index].shape.c, top_blob_index, blobs[top_blob_index].name.c_str());
        }
    }

    return 0;
}